

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Value * json_object_getn_value(JSON_Object *object,char *name,size_t name_len)

{
  uint in_EAX;
  size_t sVar1;
  unsigned_long hash;
  parson_bool_t found;
  undefined8 uStack_18;
  
  if (name != (char *)0x0 && object != (JSON_Object *)0x0) {
    if (name_len == 0) {
      hash = 0x1505;
    }
    else {
      hash = 0x1505;
      sVar1 = 0;
      do {
        if ((ulong)(byte)name[sVar1] == 0) break;
        hash = hash * 0x21 + (ulong)(byte)name[sVar1];
        sVar1 = sVar1 + 1;
      } while (name_len != sVar1);
    }
    uStack_18 = (ulong)in_EAX;
    sVar1 = json_object_get_cell_ix
                      (object,name,name_len,hash,(parson_bool_t *)((long)&uStack_18 + 4));
    if (uStack_18._4_4_ != 0) {
      return object->values[object->cells[sVar1]];
    }
  }
  return (JSON_Value *)0x0;
}

Assistant:

static JSON_Value * json_object_getn_value(const JSON_Object *object, const char *name, size_t name_len) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    unsigned long cell_ix = 0;
    size_t item_ix = 0;
    if (!object || !name) {
        return NULL;
    }
    hash = hash_string(name, name_len);
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, name_len, hash, &found);
    if (!found) {
        return NULL;
    }
    item_ix = object->cells[cell_ix];
    return object->values[item_ix];
}